

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

bool __thiscall mp::NLSolver::Solve(NLSolver *this,string *solver,string *solver_opts)

{
  pointer pcVar1;
  uint __val;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  undefined8 *puVar5;
  uint uVar6;
  ulong *puVar7;
  char *pcVar8;
  long *plVar9;
  char *pcVar10;
  ulong uVar11;
  uint __len;
  bool bVar12;
  string __str;
  string call;
  ulong *local_f0;
  long local_e8;
  ulong local_e0 [2];
  long *local_d0;
  undefined8 local_c8;
  long local_c0;
  undefined8 uStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ulong *local_90;
  long local_88;
  ulong local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  if ((this->filestub_)._M_string_length == 0) {
    pcVar10 = (char *)(this->err_msg_)._M_string_length;
    pcVar8 = "NLSolver: provide filestub.";
LAB_00106096:
    std::__cxx11::string::_M_replace((ulong)&this->err_msg_,0,pcVar10,(ulong)pcVar8);
    return false;
  }
  if (solver->_M_string_length == 0) {
    pcVar10 = (char *)(this->err_msg_)._M_string_length;
    pcVar8 = "NLSolver: provide solver.";
    goto LAB_00106096;
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  pcVar1 = (solver->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + solver->_M_string_length);
  std::__cxx11::string::push_back((char)&local_b0);
  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(this->filestub_)._M_dataplus._M_p);
  std::__cxx11::string::append((char *)&local_b0);
  std::__cxx11::string::_M_append((char *)&local_b0,(ulong)(solver_opts->_M_dataplus)._M_p);
  uVar3 = system(local_b0._M_dataplus._M_p);
  bVar12 = uVar3 == 0;
  if (bVar12) goto LAB_00106304;
  std::operator+(&local_70,"NLSolver: call \"",&local_b0);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar7 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar7) {
    local_80 = *puVar7;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *puVar7;
    local_90 = (ulong *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __val = -uVar3;
  if (0 < (int)uVar3) {
    __val = uVar3;
  }
  __len = 1;
  if (9 < __val) {
    uVar11 = (ulong)__val;
    uVar2 = 4;
    do {
      __len = uVar2;
      uVar6 = (uint)uVar11;
      if (uVar6 < 100) {
        __len = __len - 2;
        goto LAB_00106123;
      }
      if (uVar6 < 1000) {
        __len = __len - 1;
        goto LAB_00106123;
      }
      if (uVar6 < 10000) goto LAB_00106123;
      uVar11 = uVar11 / 10000;
      uVar2 = __len + 4;
    } while (99999 < uVar6);
    __len = __len + 1;
  }
LAB_00106123:
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct((ulong)&local_f0,(char)__len - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar3 >> 0x1f) + (long)local_f0),__len,__val);
  uVar11 = 0xf;
  if (local_90 != &local_80) {
    uVar11 = local_80;
  }
  if (uVar11 < (ulong)(local_e8 + local_88)) {
    uVar11 = 0xf;
    if (local_f0 != local_e0) {
      uVar11 = local_e0[0];
    }
    if (uVar11 < (ulong)(local_e8 + local_88)) goto LAB_00106197;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_90);
  }
  else {
LAB_00106197:
    puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_90,(ulong)local_f0);
  }
  local_d0 = &local_c0;
  plVar4 = puVar5 + 2;
  if ((long *)*puVar5 == plVar4) {
    local_c0 = *plVar4;
    uStack_b8 = puVar5[3];
  }
  else {
    local_c0 = *plVar4;
    local_d0 = (long *)*puVar5;
  }
  local_c8 = puVar5[1];
  *puVar5 = plVar4;
  puVar5[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_d0);
  plVar9 = plVar4 + 2;
  if ((long *)*plVar4 == plVar9) {
    local_40 = *plVar9;
    lStack_38 = plVar4[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar9;
    local_50 = (long *)*plVar4;
  }
  local_48 = plVar4[1];
  *plVar4 = (long)plVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->err_msg_,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,local_c0 + 1);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0,local_e0[0] + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
LAB_00106304:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    return bVar12;
  }
  operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  return bVar12;
}

Assistant:

bool NLSolver::Solve(const std::string& solver,
                  const std::string& solver_opts) {
  if (GetFileStub().empty())
    return (err_msg_="NLSolver: provide filestub.", false);
  if (solver.empty())
    return (err_msg_="NLSolver: provide solver.", false);
  auto call = solver;
#ifdef _WIN32
  const std::string ending{".exe"};
  if (solver.length() < ending.length()
      || (0 != solver.compare(solver.length() - ending.length(), ending.length(), ending)))
    call += ending;
#endif  // _WIN32
  call += ' ';
  call += GetFileStub();
  call += " -AMPL ";
  call += solver_opts;
  if (auto status = std::system(call.c_str()))
    return (err_msg_="NLSolver: call \""
        + call + "\" failed (code "
        + std::to_string(status) + ").", false);
  return true;
}